

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StringRef * __thiscall Catch::StringRef::operator=(StringRef *this,StringRef *other)

{
  Ownership OVar1;
  
  if (other != this) {
    deleteIfOwned(this);
    this->m_data = other->m_data;
    this->m_size = other->m_size;
    OVar1 = other->m_ownership;
    this->m_ownership = OVar1;
    if (OVar1 == FullStringOwned) {
      other->m_ownership = FullStringRef;
    }
  }
  return this;
}

Assistant:

auto StringRef::operator = ( StringRef&& other ) -> StringRef& {
        if( &other == this )
            return *this;
        deleteIfOwned();
        m_data = other.m_data;
        m_size = other.m_size;
        m_ownership = other.m_ownership;
        if( other.m_ownership == Ownership::FullStringOwned )
            other.m_ownership = Ownership::FullStringRef;
            return *this;
    }